

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_test.cc
# Opt level: O1

void __thiscall leveldb::BloomTest_Small_Test::~BloomTest_Small_Test(BloomTest_Small_Test *this)

{
  BloomTest::~BloomTest(&this->super_BloomTest);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(BloomTest, Small) {
  Add("hello");
  Add("world");
  ASSERT_TRUE(Matches("hello"));
  ASSERT_TRUE(Matches("world"));
  ASSERT_TRUE(!Matches("x"));
  ASSERT_TRUE(!Matches("foo"));
}